

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall
setup::info::load_entries<setup::delete_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::delete_entry,_std::allocator<setup::delete_entry>_> *result,
          enum_type entry_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  delete_entry entry;
  delete_entry local_158;
  
  std::vector<setup::delete_entry,_std::allocator<setup::delete_entry>_>::_M_erase_at_end
            (result,(result->
                    super__Vector_base<setup::delete_entry,_std::allocator<setup::delete_entry>_>).
                    _M_impl.super__Vector_impl_data._M_start);
  if (NoUnknownVersion < entry_type) {
    std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)entry_type
               ,0x15);
  }
  if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w >> ((ulong)entry_type & 0x3f) & 1) == 0) {
    if (count != 0) {
      paVar1 = &local_158.super_item.before_install.field_2;
      paVar2 = &local_158.name.field_2;
      do {
        local_158.super_item.components._M_dataplus._M_p =
             (pointer)&local_158.super_item.components.field_2;
        local_158.super_item.components._M_string_length = 0;
        local_158.super_item.components.field_2._M_local_buf[0] = '\0';
        local_158.super_item.tasks._M_dataplus._M_p = (pointer)&local_158.super_item.tasks.field_2;
        local_158.super_item.tasks._M_string_length = 0;
        local_158.super_item.tasks.field_2._M_local_buf[0] = '\0';
        local_158.super_item.languages._M_dataplus._M_p =
             (pointer)&local_158.super_item.languages.field_2;
        local_158.super_item.languages._M_string_length = 0;
        local_158.super_item.languages.field_2._M_local_buf[0] = '\0';
        local_158.super_item.check._M_dataplus._M_p = (pointer)&local_158.super_item.check.field_2;
        local_158.super_item.check._M_string_length = 0;
        local_158.super_item.check.field_2._M_local_buf[0] = '\0';
        local_158.super_item.after_install._M_dataplus._M_p =
             (pointer)&local_158.super_item.after_install.field_2;
        local_158.super_item.after_install._M_string_length = 0;
        local_158.super_item.after_install.field_2._M_local_buf[0] = '\0';
        local_158.super_item.before_install._M_string_length = 0;
        local_158.super_item.before_install.field_2._M_local_buf[0] = '\0';
        local_158.name._M_string_length = 0;
        local_158.name.field_2._M_local_buf[0] = '\0';
        local_158.super_item.before_install._M_dataplus._M_p = (pointer)paVar1;
        local_158.name._M_dataplus._M_p = (pointer)paVar2;
        delete_entry::load(&local_158,is,this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.name._M_dataplus._M_p != paVar2) {
          operator_delete(local_158.name._M_dataplus._M_p,
                          CONCAT71(local_158.name.field_2._M_allocated_capacity._1_7_,
                                   local_158.name.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.super_item.before_install._M_dataplus._M_p != paVar1) {
          operator_delete(local_158.super_item.before_install._M_dataplus._M_p,
                          CONCAT71(local_158.super_item.before_install.field_2._M_allocated_capacity
                                   ._1_7_,local_158.super_item.before_install.field_2._M_local_buf
                                          [0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.super_item.after_install._M_dataplus._M_p !=
            &local_158.super_item.after_install.field_2) {
          operator_delete(local_158.super_item.after_install._M_dataplus._M_p,
                          CONCAT71(local_158.super_item.after_install.field_2._M_allocated_capacity.
                                   _1_7_,local_158.super_item.after_install.field_2._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.super_item.check._M_dataplus._M_p != &local_158.super_item.check.field_2) {
          operator_delete(local_158.super_item.check._M_dataplus._M_p,
                          CONCAT71(local_158.super_item.check.field_2._M_allocated_capacity._1_7_,
                                   local_158.super_item.check.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.super_item.languages._M_dataplus._M_p !=
            &local_158.super_item.languages.field_2) {
          operator_delete(local_158.super_item.languages._M_dataplus._M_p,
                          CONCAT71(local_158.super_item.languages.field_2._M_allocated_capacity.
                                   _1_7_,local_158.super_item.languages.field_2._M_local_buf[0]) + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.super_item.tasks._M_dataplus._M_p != &local_158.super_item.tasks.field_2) {
          operator_delete(local_158.super_item.tasks._M_dataplus._M_p,
                          CONCAT71(local_158.super_item.tasks.field_2._M_allocated_capacity._1_7_,
                                   local_158.super_item.tasks.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.super_item.components._M_dataplus._M_p !=
            &local_158.super_item.components.field_2) {
          operator_delete(local_158.super_item.components._M_dataplus._M_p,
                          CONCAT71(local_158.super_item.components.field_2._M_allocated_capacity.
                                   _1_7_,local_158.super_item.components.field_2._M_local_buf[0]) +
                          1);
        }
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    std::vector<setup::delete_entry,_std::allocator<setup::delete_entry>_>::resize(result,count);
    if (count != 0) {
      lVar3 = 0;
      do {
        delete_entry::load((delete_entry *)
                           ((long)&(((result->
                                     super__Vector_base<setup::delete_entry,_std::allocator<setup::delete_entry>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->super_item).
                                   components._M_dataplus + lVar3),is,this);
        lVar3 = lVar3 + 0x128;
        count = count - 1;
      } while (count != 0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}